

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VIRTUALSetPageBits(UINT nStatus,SIZE_T nStartingBit,SIZE_T nNumberOfBits,BYTE *pBitArray)

{
  ulong uVar1;
  ulong uVar2;
  int __c;
  SIZE_T nFullBytes;
  SIZE_T nLastByte;
  SIZE_T nFirstByte;
  SIZE_T nLastBit;
  BYTE byte_mask;
  BYTE *pBitArray_local;
  SIZE_T nNumberOfBits_local;
  SIZE_T nStartingBit_local;
  UINT nStatus_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (nNumberOfBits == 0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    nStartingBit_local._4_4_ = 0;
  }
  else {
    uVar1 = (nStartingBit + nNumberOfBits) - 1;
    nLastByte = nStartingBit >> 3;
    uVar2 = uVar1 >> 3;
    if ((nStartingBit & 7) != 0) {
      nLastBit._7_1_ = VIRTUALSetPageBits::startmasks[nStartingBit & 7];
      if (uVar2 == nLastByte) {
        nLastBit._7_1_ = nLastBit._7_1_ & VIRTUALSetPageBits::endmasks[uVar1 & 7];
      }
      if (nStatus == 0) {
        pBitArray[nLastByte] = pBitArray[nLastByte] & (nLastBit._7_1_ ^ 0xff);
      }
      else {
        pBitArray[nLastByte] = pBitArray[nLastByte] | nLastBit._7_1_;
      }
      if (uVar2 == nLastByte) {
        return 1;
      }
      nLastByte = nLastByte + 1;
    }
    if (uVar2 - nLastByte != 0) {
      __c = 0xff;
      if (nStatus == 0) {
        __c = 0;
      }
      memset(pBitArray + nLastByte,__c,uVar2 - nLastByte);
    }
    if (nStatus == 0) {
      pBitArray[uVar2] = pBitArray[uVar2] & (VIRTUALSetPageBits::endmasks[uVar1 & 7] ^ 0xff);
    }
    else {
      pBitArray[uVar2] = pBitArray[uVar2] | VIRTUALSetPageBits::endmasks[uVar1 & 7];
    }
    nStartingBit_local._4_4_ = 1;
  }
  return nStartingBit_local._4_4_;
}

Assistant:

static BOOL VIRTUALSetPageBits ( UINT nStatus, SIZE_T nStartingBit,
                                 SIZE_T nNumberOfBits, BYTE * pBitArray )
{
    /* byte masks for optimized modification of partial bytes (changing less
       than 8 bits in a single byte). note that bits are treated in little
       endian order : value 1 is bit 0; value 128 is bit 7. in the binary
       representations below, bit 0 is on the right */

    /* start masks : for modifying bits >= n while preserving bits < n.
       example : if nStartignBit%8 is 3, then bits 0, 1, 2 remain unchanged
       while bits 3..7 are changed; startmasks[3] can be used for this.  */
    static const BYTE startmasks[8] = {
      0xff, /* start at 0 : 1111 1111 */
      0xfe, /* start at 1 : 1111 1110 */
      0xfc, /* start at 2 : 1111 1100 */
      0xf8, /* start at 3 : 1111 1000 */
      0xf0, /* start at 4 : 1111 0000 */
      0xe0, /* start at 5 : 1110 0000 */
      0xc0, /* start at 6 : 1100 0000 */
    0x80  /* start at 7 : 1000 0000 */
    };

    /* end masks : for modifying bits <= n while preserving bits > n.
       example : if the last bit to change is 5, then bits 6 & 7 stay unchanged
       while bits 1..5 are changed; endmasks[5] can be used for this.  */
    static const BYTE endmasks[8] = {
      0x01, /* end at 0 : 0000 0001 */
      0x03, /* end at 1 : 0000 0011 */
      0x07, /* end at 2 : 0000 0111 */
      0x0f, /* end at 3 : 0000 1111 */
      0x1f, /* end at 4 : 0001 1111 */
      0x3f, /* end at 5 : 0011 1111 */
      0x7f, /* end at 6 : 0111 1111 */
      0xff  /* end at 7 : 1111 1111 */
    };
    /* last example : if only the middle of a byte must be changed, both start
       and end masks can be combined (bitwise AND) to obtain the correct mask.
       if we want to change bits 2 to 4 :
       startmasks[2] : 0xfc   1111 1100  (change 2,3,4,5,6,7)
       endmasks[4]:    0x1f   0001 1111  (change 0,1,2,3,4)
       bitwise AND :   0x1c   0001 1100  (change 2,3,4)
    */

    BYTE byte_mask;
    SIZE_T nLastBit;
    SIZE_T nFirstByte;
    SIZE_T nLastByte;
    SIZE_T nFullBytes;

    TRACE( "VIRTUALSetPageBits( nStatus = %d, nStartingBit = %d, "
           "nNumberOfBits = %d, pBitArray = 0x%p )\n",
           nStatus, nStartingBit, nNumberOfBits, pBitArray );

    if ( 0 == nNumberOfBits )
    {
        ERROR( "nNumberOfBits was 0!\n" );
        return FALSE;
    }

    nLastBit = nStartingBit+nNumberOfBits-1;
    nFirstByte = nStartingBit / 8;
    nLastByte = nLastBit / 8;

    /* handle partial first byte (if any) */
    if(0 != (nStartingBit % 8))
    {
        byte_mask = startmasks[nStartingBit % 8];

        /* if 1st byte is the only changing byte, combine endmask to preserve
           trailing bits (see 3rd example above) */
        if( nLastByte == nFirstByte)
        {
            byte_mask &= endmasks[nLastBit % 8];
        }

        /* byte_mask contains 1 for bits to change, 0 for bits to leave alone */
        if(0 == nStatus)
        {
            /* bits to change must be set to 0 : invert byte_mask (giving 0 for
               bits to change), use bitwise AND */
            pBitArray[nFirstByte] &= ~byte_mask;
        }
        else
        {
            /* bits to change must be set to 1 : use bitwise OR */
            pBitArray[nFirstByte] |= byte_mask;
        }

        /* stop right away if only 1 byte is being modified */
        if(nLastByte == nFirstByte)
        {
            return TRUE;
        }

        /* we're done with the 1st byte; skip over it */
        nFirstByte++;
    }

    /* number of bytes to change, excluding the last byte (handled separately)*/
    nFullBytes = nLastByte - nFirstByte;

    if(0 != nFullBytes)
    {
        // Turn off/on dirty bits
        memset( &(pBitArray[nFirstByte]), (0 == nStatus) ? 0 : 0xFF, nFullBytes );
    }

    /* handle last (possibly partial) byte */
    byte_mask = endmasks[nLastBit % 8];

    /* byte_mask contains 1 for bits to change, 0 for bits to leave alone */
    if(0 == nStatus)
    {
        /* bits to change must be set to 0 : invert byte_mask (giving 0 for
           bits to change), use bitwise AND */
        pBitArray[nLastByte] &= ~byte_mask;
    }
    else
    {
        /* bits to change must be set to 1 : use bitwise OR */
        pBitArray[nLastByte] |= byte_mask;
    }

    return TRUE;
}